

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

void __thiscall luna::String::SetValue(String *this,char *str,size_t len)

{
  char cVar1;
  char *__dest;
  anon_union_16_2_eed97686_for_String_2 *paVar2;
  size_t sVar3;
  
  if (((this->super_GCObject).field_0x11 != '\0') && ((this->field_1).str_ != (char *)0x0)) {
    operator_delete__((this->field_1).str_);
  }
  this->length_ = (uint)len;
  if (len < 0xb) {
    memcpy(&this->field_1,str,len);
    (this->field_1).str_buffer_[len] = '\0';
    (this->super_GCObject).field_0x11 = 0;
    this->hash_ = 0x1505;
    cVar1 = (this->field_1).str_buffer_[0];
    if (cVar1 != '\0') {
      paVar2 = &this->field_1;
      sVar3 = 0x1505;
      do {
        paVar2 = (anon_union_16_2_eed97686_for_String_2 *)(paVar2->str_buffer_ + 1);
        sVar3 = (long)cVar1 + sVar3 * 0x21;
        this->hash_ = sVar3;
        cVar1 = paVar2->str_buffer_[0];
      } while (cVar1 != '\0');
    }
  }
  else {
    __dest = (char *)operator_new__(len + 1);
    (this->field_1).str_ = __dest;
    memcpy(__dest,str,len);
    __dest[len] = '\0';
    (this->super_GCObject).field_0x11 = 1;
    this->hash_ = 0x1505;
    cVar1 = *__dest;
    if (cVar1 != '\0') {
      sVar3 = 0x1505;
      do {
        __dest = __dest + 1;
        sVar3 = (long)cVar1 + sVar3 * 0x21;
        cVar1 = *__dest;
      } while (cVar1 != '\0');
      this->hash_ = sVar3;
    }
  }
  return;
}

Assistant:

void String::SetValue(const char *str, std::size_t len)
    {
        if (in_heap_)
            delete [] str_;

        length_ = len;
        if (len < sizeof(str_buffer_))
        {
            memcpy(str_buffer_, str, len);
            str_buffer_[len] = 0;
            in_heap_ = 0;
            Hash(str_buffer_);
        }
        else
        {
            str_ = new char[len + 1];
            memcpy(str_, str, len);
            str_[len] = 0;
            in_heap_ = 1;
            Hash(str_);
        }
    }